

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  FILE *pFVar2;
  int iVar3;
  int iVar4;
  FILE *fp_00;
  OPENSSL_sk_compfunc p_Var5;
  X509 *ptr;
  X509 *pXVar6;
  int *piVar7;
  char *pcVar8;
  OPENSSL_STACK *pOVar9;
  code *pcVar10;
  long lVar11;
  ptls_iovec_t pVar12;
  uint8_t *local_1c0;
  uint8_t *local_1b8;
  undefined1 local_1b0 [8];
  ptls_buffer_t sessdata;
  FILE *fp_1;
  X509 *cert;
  FILE *fp;
  undefined1 local_170 [4];
  socklen_t salen;
  sockaddr_storage sa;
  int ch;
  int use_early_data;
  EVP_PKEY *pkey;
  stack_st_X509 *certs;
  char *port;
  char *host;
  ptls_handshake_properties_t hsprop;
  ptls_openssl_verify_certificate_t verify_certificate;
  ptls_context_t ctx;
  ptls_save_ticket_t save_ticket;
  ptls_encrypt_ticket_t decrypt_ticket;
  ptls_encrypt_ticket_t encrypt_ticket;
  ptls_openssl_lookup_certificate_t lookup_certificate;
  char **argv_local;
  int argc_local;
  
  OPENSSL_init_crypto(2,0);
  OPENSSL_init_crypto(0xc);
  ENGINE_load_builtin_engines();
  ENGINE_register_all_ciphers();
  ENGINE_register_all_digests();
  decrypt_ticket.cb = encrypt_ticket_cb;
  save_ticket.cb = decrypt_ticket_cb;
  ctx.save_ticket = (ptls_save_ticket_t *)save_ticket_cb;
  verify_certificate.cert_store = (X509_STORE *)ptls_openssl_random_bytes;
  ctx.random_bytes = (_func_void_void_ptr_size_t *)ptls_openssl_key_exchanges;
  ctx.key_exchanges = (ptls_key_exchange_algorithm_t **)ptls_openssl_cipher_suites;
  ctx.cipher_suites = (ptls_cipher_suite_t **)&encrypt_ticket;
  ctx.lookup_certificate = (ptls_lookup_certificate_t *)0x0;
  ctx.verify_certificate._0_4_ = 0x15180;
  ctx.verify_certificate._4_4_ = 0x2000;
  ctx.ticket_lifetime = 0;
  ctx._48_8_ = &decrypt_ticket;
  ctx.encrypt_ticket = (ptls_encrypt_ticket_t *)&save_ticket;
  ctx.decrypt_ticket = (ptls_encrypt_ticket_t *)&ctx.save_ticket;
  memset((void *)((long)&hsprop + 0x18),0,0x10);
  memset(&host,0,0x20);
  pkey = (EVP_PKEY *)0x0;
  _ch = (EVP_PKEY *)0x0;
  sa.__ss_align._4_4_ = 0;
  ptls_openssl_init_lookup_certificate((ptls_openssl_lookup_certificate_t *)&encrypt_ticket);
  while (sa.__ss_align._0_4_ = getopt(argc,argv,"c:k:es:vh"), (int)sa.__ss_align != -1) {
    switch((int)sa.__ss_align) {
    case 99:
      fp_00 = fopen(_optarg,"rb");
      pFVar2 = _stderr;
      pcVar1 = _optarg;
      if (fp_00 == (FILE *)0x0) {
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        fprintf(pFVar2,"failed to open file:%s:%s\n",pcVar1,pcVar8);
        return 1;
      }
      p_Var5 = ossl_check_X509_compfunc_type((sk_X509_compfunc)0x0);
      pkey = (EVP_PKEY *)OPENSSL_sk_new(p_Var5);
      while (ptr = PEM_read_X509(fp_00,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0),
            ptr != (X509 *)0x0) {
        pOVar9 = ossl_check_X509_sk_type((stack_st_X509 *)pkey);
        pXVar6 = ossl_check_X509_type((X509 *)ptr);
        OPENSSL_sk_push(pOVar9,pXVar6);
      }
      fclose(fp_00);
      pOVar9 = ossl_check_const_X509_sk_type((stack_st_X509 *)pkey);
      iVar3 = OPENSSL_sk_num(pOVar9);
      if (iVar3 == 0) {
        fprintf(_stderr,"failed to load certificate chain from file:%s\n",_optarg);
        return 1;
      }
      break;
    default:
      usage(*argv);
      exit(1);
    case 0x65:
      sa.__ss_align._4_4_ = 1;
      break;
    case 0x6b:
      sessdata._24_8_ = fopen(_optarg,"rb");
      pFVar2 = _stderr;
      pcVar1 = _optarg;
      if ((FILE *)sessdata._24_8_ == (FILE *)0x0) {
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        fprintf(pFVar2,"failed to open file:%s:%s\n",pcVar1,pcVar8);
        return 1;
      }
      _ch = PEM_read_PrivateKey((FILE *)sessdata._24_8_,(EVP_PKEY **)0x0,(undefined1 *)0x0,
                                (void *)0x0);
      fclose((FILE *)sessdata._24_8_);
      if (_ch == (EVP_PKEY *)0x0) {
        fprintf(_stderr,"failed to load private key from file:%s\n",_optarg);
        return 1;
      }
      break;
    case 0x73:
      session_file = _optarg;
      break;
    case 0x76:
      ptls_openssl_init_verify_certificate
                ((ptls_openssl_verify_certificate_t *)((long)&hsprop + 0x18),(X509_STORE *)0x0);
    }
  }
  iVar3 = argc - _optind;
  lVar11 = (long)_optind;
  if ((pkey == (EVP_PKEY *)0x0) && (_ch == (EVP_PKEY *)0x0)) {
    if (session_file != (char *)0x0) {
      ptls_buffer_init((ptls_buffer_t *)local_1b0,"",0);
      iVar4 = load_ticket((ptls_buffer_t *)local_1b0);
      if (iVar4 == 0) {
        pVar12 = ptls_iovec_init((void *)local_1b0,sessdata.capacity);
        local_1c0 = pVar12.base;
        host = (char *)local_1c0;
        local_1b8 = (uint8_t *)pVar12.len;
        hsprop.client.session_ticket.base = local_1b8;
      }
    }
    if (sa.__ss_align._4_4_ != 0) {
      hsprop.client.session_ticket.len = (size_t)&main::max_early_data_size;
    }
  }
  else {
    if ((pkey == (EVP_PKEY *)0x0) || (_ch == (EVP_PKEY *)0x0)) {
      fprintf(_stderr,"-c and -k options must be used together\n");
      return 1;
    }
    if (session_file != (char *)0x0) {
      fprintf(_stderr,"-s option cannot be used for server\n");
      return 1;
    }
    if (sa.__ss_align._4_4_ != 0) {
      fprintf(_stderr,"-e option cannot be used for server\n");
      return 1;
    }
    ptls_openssl_lookup_certificate_add_identity
              ((ptls_openssl_lookup_certificate_t *)&encrypt_ticket,"example.com",(EVP_PKEY *)_ch,
               (stack_st_X509 *)pkey);
    pOVar9 = ossl_check_X509_sk_type((stack_st_X509 *)pkey);
    OPENSSL_sk_free(pOVar9);
    EVP_PKEY_free(_ch);
  }
  if (hsprop._24_8_ == 0) {
    ptls_openssl_init_verify_certificate
              ((ptls_openssl_verify_certificate_t *)((long)&hsprop + 0x18),(X509_STORE *)0x0);
  }
  ctx.lookup_certificate = (ptls_lookup_certificate_t *)((long)&hsprop + 0x18);
  if (iVar3 != 2) {
    fprintf(_stderr,"missing host and port\n");
    return 1;
  }
  iVar3 = resolve_address((sockaddr *)local_170,(socklen_t *)((long)&fp + 4),argv[lVar11],
                          (argv + lVar11)[1]);
  if (iVar3 == 0) {
    pcVar10 = run_client;
    if (pkey != (EVP_PKEY *)0x0) {
      pcVar10 = run_server;
    }
    iVar3 = (*pcVar10)(local_170,fp._4_4_,&verify_certificate.cert_store,&host);
    return iVar3;
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    ptls_openssl_lookup_certificate_t lookup_certificate;
    ptls_encrypt_ticket_t encrypt_ticket = {encrypt_ticket_cb}, decrypt_ticket = {decrypt_ticket_cb};
    ptls_save_ticket_t save_ticket = {save_ticket_cb};
    ptls_context_t ctx = {ptls_openssl_random_bytes,
                          ptls_openssl_key_exchanges,
                          ptls_openssl_cipher_suites,
                          &lookup_certificate.super,
                          NULL,
                          86400,
                          8192,
                          0,
                          &encrypt_ticket,
                          &decrypt_ticket,
                          &save_ticket};
    ptls_openssl_verify_certificate_t verify_certificate = {{NULL}};
    ptls_handshake_properties_t hsprop = {{{NULL}}};
    const char *host, *port;
    STACK_OF(X509) *certs = NULL;
    EVP_PKEY *pkey = NULL;
    int use_early_data = 0, ch;
    struct sockaddr_storage sa;
    socklen_t salen;

    ptls_openssl_init_lookup_certificate(&lookup_certificate);

    while ((ch = getopt(argc, argv, "c:k:es:vh")) != -1) {
        switch (ch) {
        case 'c': {
            FILE *fp;
            X509 *cert;
            if ((fp = fopen(optarg, "rb")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                return 1;
            }
            certs = sk_X509_new(NULL);
            while ((cert = PEM_read_X509(fp, NULL, NULL, NULL)) != NULL)
                sk_X509_push(certs, cert);
            fclose(fp);
            if (sk_X509_num(certs) == 0) {
                fprintf(stderr, "failed to load certificate chain from file:%s\n", optarg);
                return 1;
            }
        } break;
        case 'k': {
            FILE *fp;
            if ((fp = fopen(optarg, "rb")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                return 1;
            }
            pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL);
            fclose(fp);
            if (pkey == NULL) {
                fprintf(stderr, "failed to load private key from file:%s\n", optarg);
                return 1;
            }
        } break;
        case 'e':
            use_early_data = 1;
            break;
        case 's':
            session_file = optarg;
            break;
        case 'v':
            ptls_openssl_init_verify_certificate(&verify_certificate, NULL);
            break;
        default:
            usage(argv[0]);
            exit(1);
        }
    }
    argc -= optind;
    argv += optind;
    if (certs != NULL || pkey != NULL) {
        /* server */
        if (certs == NULL || pkey == NULL) {
            fprintf(stderr, "-c and -k options must be used together\n");
            return 1;
        }
        if (session_file != NULL) {
            fprintf(stderr, "-s option cannot be used for server\n");
            return 1;
        }
        if (use_early_data) {
            fprintf(stderr, "-e option cannot be used for server\n");
            return 1;
        }
        ptls_openssl_lookup_certificate_add_identity(&lookup_certificate, "example.com", pkey, certs);
        sk_X509_free(certs);
        EVP_PKEY_free(pkey);
    } else {
        /* client */
        if (session_file != NULL) {
            ptls_buffer_t sessdata;
            ptls_buffer_init(&sessdata, "", 0);
            if (load_ticket(&sessdata) == 0)
                hsprop.client.session_ticket = ptls_iovec_init(sessdata.base, sessdata.off);
        }
        if (use_early_data) {
            static size_t max_early_data_size;
            hsprop.client.max_early_data_size = &max_early_data_size;
        }
    }
    if (verify_certificate.super.cb == NULL)
        ptls_openssl_init_verify_certificate(&verify_certificate, NULL);
    ctx.verify_certificate = &verify_certificate.super;
    if (argc != 2) {
        fprintf(stderr, "missing host and port\n");
        return 1;
    }
    host = (--argc, *argv++);
    port = (--argc, *argv++);

    if (resolve_address((struct sockaddr *)&sa, &salen, host, port) != 0)
        exit(1);

    return (certs != NULL ? run_server : run_client)((struct sockaddr *)&sa, salen, &ctx, &hsprop);
}